

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::PanIdQuery
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint32_t aChannelMask,
          uint16_t aPanId,string *aDstAddr)

{
  promise<ot::commissioner::Error> local_88;
  function<void_(ot::commissioner::Error)> local_68;
  anon_class_8_1_ba1d6e0d local_48;
  anon_class_8_1_ba1d6e0d wait;
  promise<ot::commissioner::Error> pro;
  string *aDstAddr_local;
  uint16_t aPanId_local;
  uint32_t aChannelMask_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait);
  local_48.pro = (promise<ot::commissioner::Error> *)&wait;
  std::function<void(ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::PanIdQuery(unsigned_int,unsigned_short,std::__cxx11::string_const&)::__0&,void>
            ((function<void(ot::commissioner::Error)> *)&local_68,&local_48);
  (*(this->super_Commissioner)._vptr_Commissioner[0x2d])
            (this,&local_68,(ulong)aChannelMask,(ulong)aPanId,aDstAddr);
  std::function<void_(ot::commissioner::Error)>::~function(&local_68);
  std::promise<ot::commissioner::Error>::get_future(&local_88);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_88);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_88);
  std::promise<ot::commissioner::Error>::~promise((promise<ot::commissioner::Error> *)&wait);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::PanIdQuery(uint32_t aChannelMask, uint16_t aPanId, const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };

    PanIdQuery(wait, aChannelMask, aPanId, aDstAddr);
    return pro.get_future().get();
}